

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager_worker.c
# Opt level: O2

apx_error_t
apx_fileManagerWorker_prepare_send_local_const_data
          (apx_fileManagerWorker_t *self,uint32_t address,uint8_t *data,uint32_t size)

{
  adt_buf_err_t aVar1;
  int iVar2;
  apx_command_t cmd;
  
  if (self != (apx_fileManagerWorker_t *)0x0) {
    apx_build_command_with_ptr(&cmd,'\a',address,size,data,(void *)0x0);
    pthread_spin_lock(&self->queue_lock);
    aVar1 = adt_rbfh_insert(&self->queue,&cmd.cmd_type);
    pthread_spin_unlock(&self->queue_lock);
    sem_post((sem_t *)&self->semaphore);
    iVar2 = 0x26;
    if (aVar1 != '\x02') {
      iVar2 = (uint)(aVar1 == '\x01') * 2;
    }
    return iVar2;
  }
  return 1;
}

Assistant:

apx_error_t apx_fileManagerWorker_prepare_send_local_const_data(apx_fileManagerWorker_t* self, uint32_t address, uint8_t const* data, uint32_t size)
{
   if (self != NULL)
   {
      adt_buf_err_t rc;
      apx_command_t cmd;
      apx_build_command_with_ptr(&cmd, APX_CMD_SEND_LOCAL_CONST_DATA, address, size, (void*) data, NULL);
      SPINLOCK_ENTER(self->queue_lock);
      rc = adt_rbfh_insert(&self->queue, (const uint8_t*)&cmd);
      SPINLOCK_LEAVE(self->queue_lock);
#ifndef UNIT_TEST
      SEMAPHORE_POST(self->semaphore);
#endif
      return apx_fileManagerWorker_process_ringbuffer_error(rc);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}